

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

int metacall_initialize_ex(metacall_initialize_configuration_type *initialize_config)

{
  int iVar1;
  loader_impl plVar2;
  long in_RDI;
  loader_impl impl;
  size_t index;
  void *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar3;
  long local_18;
  
  local_18 = 0;
  iVar1 = metacall_initialize();
  if (iVar1 != 1) {
    while( true ) {
      uVar3 = false;
      if (*(long *)(in_RDI + local_18 * 0x10) == 0) {
        uVar3 = *(long *)(in_RDI + local_18 * 0x10 + 8) == 0;
      }
      if (((uVar3 ^ 0xff) & 1) == 0) {
        return 0;
      }
      plVar2 = loader_get_impl(in_stack_ffffffffffffffd0);
      if (plVar2 == (loader_impl)0x0) {
        log_write_impl_va("metacall",0x166,"metacall_initialize_ex",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                          ,LOG_LEVEL_ERROR,"MetaCall failed to find \'%s_loader\'",
                          *(undefined8 *)(in_RDI + local_18 * 0x10));
        return 1;
      }
      loader_set_options(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      iVar1 = loader_get_option_host(in_stack_ffffffffffffffd0);
      if ((iVar1 != 0) &&
         (iVar1 = loader_initialize_host((char *)CONCAT17(uVar3,in_stack_ffffffffffffffd8)),
         iVar1 != 0)) break;
      local_18 = local_18 + 1;
    }
    log_write_impl_va("metacall",0x171,"metacall_initialize_ex",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                      ,LOG_LEVEL_ERROR,"MetaCall failed to initialize \'%s_loader\' as host",
                      *(undefined8 *)(in_RDI + local_18 * 0x10));
  }
  return 1;
}

Assistant:

int metacall_initialize_ex(struct metacall_initialize_configuration_type initialize_config[])
{
	size_t index = 0;

	if (metacall_initialize() == 1)
	{
		return 1;
	}

	while (!(initialize_config[index].tag == NULL && initialize_config[index].options == NULL))
	{
		loader_impl impl = loader_get_impl(initialize_config[index].tag);

		if (impl == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "MetaCall failed to find '%s_loader'", initialize_config[index].tag);
			return 1;
		}

		loader_set_options(initialize_config[index].tag, initialize_config[index].options);

		/* If we are initializing a loader as a host, we must initialize it */
		if (loader_get_option_host(initialize_config[index].tag))
		{
			if (loader_initialize_host(initialize_config[index].tag) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "MetaCall failed to initialize '%s_loader' as host", initialize_config[index].tag);
				return 1;
			}
		}

		++index;
	}

	return 0;
}